

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaForce.c
# Opt level: O0

void Frc_ManCrossCutTest(Frc_Man_t *p,Vec_Int_t *vOrderInit)

{
  uint uVar1;
  Vec_Int_t *local_28;
  Vec_Int_t *vOrder;
  Vec_Int_t *vOrderInit_local;
  Frc_Man_t *p_local;
  
  local_28 = vOrderInit;
  if (vOrderInit == (Vec_Int_t *)0x0) {
    local_28 = Frc_ManCollectCos(p);
  }
  uVar1 = Frc_ManCrossCut(p,local_28,0);
  printf("CrossCut = %6d\n",(ulong)uVar1);
  uVar1 = Frc_ManCrossCut(p,local_28,1);
  printf("CrossCut = %6d\n",(ulong)uVar1);
  Vec_IntReverseOrder(local_28);
  uVar1 = Frc_ManCrossCut(p,local_28,0);
  printf("CrossCut = %6d\n",(ulong)uVar1);
  uVar1 = Frc_ManCrossCut(p,local_28,1);
  printf("CrossCut = %6d\n",(ulong)uVar1);
  Vec_IntReverseOrder(local_28);
  if (local_28 != vOrderInit) {
    Vec_IntFree(local_28);
  }
  return;
}

Assistant:

void Frc_ManCrossCutTest( Frc_Man_t * p, Vec_Int_t * vOrderInit )
{
    Vec_Int_t * vOrder;
//    abctime clk = Abc_Clock();
    vOrder = vOrderInit? vOrderInit : Frc_ManCollectCos( p );
    printf( "CrossCut = %6d\n", Frc_ManCrossCut( p, vOrder, 0 ) );
    printf( "CrossCut = %6d\n", Frc_ManCrossCut( p, vOrder, 1 ) );
    Vec_IntReverseOrder( vOrder );
    printf( "CrossCut = %6d\n", Frc_ManCrossCut( p, vOrder, 0 ) );
    printf( "CrossCut = %6d\n", Frc_ManCrossCut( p, vOrder, 1 ) );
    Vec_IntReverseOrder( vOrder );
    if ( vOrder != vOrderInit )
        Vec_IntFree( vOrder );
//    ABC_PRT( "Time", Abc_Clock() - clk );
}